

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void> *this,Arg *arg)

{
  int iVar1;
  int iVar2;
  LongLong LVar3;
  uint *puVar4;
  int *piVar5;
  LongLong *pLVar6;
  
  switch(arg->type) {
  case INT:
  case UINT:
  case CHAR:
    iVar1 = (arg->super_Value).field_0.int_value;
    if ((*(int *)(this + 8) == 0x69) || (*(int *)(this + 8) == 100)) {
      piVar5 = *(int **)this;
      piVar5[4] = 2;
    }
    else {
      piVar5 = *(int **)this;
      piVar5[4] = 3;
    }
    *piVar5 = iVar1;
    return;
  case LONG_LONG:
  case ULONG_LONG:
    LVar3 = (arg->super_Value).field_0.long_long_value;
    if ((*(int *)(this + 8) == 0x69) || (*(int *)(this + 8) == 100)) {
      pLVar6 = *(LongLong **)this;
      *(undefined4 *)(pLVar6 + 2) = 4;
    }
    else {
      pLVar6 = *(LongLong **)this;
      *(undefined4 *)(pLVar6 + 2) = 5;
    }
    *pLVar6 = LVar3;
    return;
  case BOOL:
    break;
  default:
    return;
  }
  iVar1 = (arg->super_Value).field_0.int_value;
  iVar2 = *(int *)(this + 8);
  if (iVar2 != 100) {
    if (iVar2 == 0x73) {
      return;
    }
    if (iVar2 != 0x69) {
      puVar4 = *(uint **)this;
      puVar4[4] = 3;
      goto LAB_0013a093;
    }
  }
  puVar4 = *(uint **)this;
  puVar4[4] = 2;
LAB_0013a093:
  *puVar4 = (uint)(iVar1 != 0);
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }